

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_>::RandomWordTestData
          (RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> *this,
          char8_t in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  __normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> local_38;
  const_iterator local_30;
  size_t local_28;
  size_t in_fixed_word_length_local;
  size_t in_fixed_word_count_local;
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> *pRStack_10;
  char8_t in_delim_local;
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> *this_local;
  
  local_28 = in_fixed_word_length;
  in_fixed_word_length_local = in_fixed_word_count;
  in_fixed_word_count_local._7_1_ = in_delim;
  pRStack_10 = this;
  std::vector<char8_t,_std::allocator<char8_t>_>::vector(&this->m_delim);
  this->m_fixed_word_count = in_fixed_word_length_local;
  this->m_fixed_word_length = local_28;
  std::vector<char8_t,_std::allocator<char8_t>_>::vector(&this->m_str);
  std::
  vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
  ::vector(&this->m_tokens);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_token_indexes);
  local_38._M_current =
       (char8_t *)std::vector<char8_t,_std::allocator<char8_t>_>::end(&this->m_delim);
  __gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>::
  __normal_iterator<char8_t*>
            ((__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>> *)
             &local_30,&local_38);
  std::vector<char8_t,_std::allocator<char8_t>_>::insert
            (&this->m_delim,local_30,(value_type *)((long)&in_fixed_word_count_local + 7));
  populate(this);
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}